

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerSpeed::DoEffect(APowerSpeed *this)

{
  byte *pbVar1;
  double dVar2;
  AInventory *pAVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  undefined4 extraout_var;
  AActor *pAVar8;
  PClass *pPVar9;
  AActor *pAVar10;
  AInventory *pAVar11;
  AActor *pAVar12;
  PClass *pPVar13;
  bool bVar14;
  DVector3 local_38;
  PClass *pPVar7;
  
  APowerup::DoEffect(&this->super_APowerup);
  pAVar8 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar8 == (AActor *)0x0) {
    return;
  }
  if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    return;
  }
  if (pAVar8->player == (player_t *)0x0) {
    return;
  }
  if ((pAVar8->player->cheats & 0x2000) != 0) {
    return;
  }
  if ((this->SpeedFlags & 1) != 0) {
    return;
  }
  if (((byte)level.time & 1) != 0) {
    return;
  }
  pAVar3 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
  if (pAVar3 != (AInventory *)0x0) {
    pPVar13 = RegistrationInfo.MyClass;
    if (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      do {
        pAVar11 = pAVar3;
        pPVar7 = (pAVar11->super_AActor).super_DThinker.super_DObject.Class;
        pPVar9 = pPVar13;
        if (pPVar7 == (PClass *)0x0) {
          iVar6 = (**(pAVar11->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar11);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
          (pAVar11->super_AActor).super_DThinker.super_DObject.Class = pPVar7;
          pPVar9 = RegistrationInfo.MyClass;
        }
        bVar14 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar13 && bVar14) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar14 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar13) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if ((bVar14) &&
           (((ulong)pAVar11[1].super_AActor.super_DThinker.super_DObject.ObjNext & 1) == 0)) {
          return;
        }
        pAVar3 = (pAVar11->super_AActor).Inventory.field_0.p;
        if (pAVar3 == (AInventory *)0x0) goto LAB_006073d3;
        pPVar13 = pPVar9;
      } while (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
      (pAVar11->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
LAB_006073d3:
      pAVar8 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
    }
    else {
      (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  dVar2 = (pAVar8->Vel).X;
  dVar4 = (pAVar8->Vel).Y;
  dVar5 = (pAVar8->Vel).Z;
  if (dVar5 * dVar5 + dVar2 * dVar2 + dVar4 * dVar4 <= 144.0) {
    return;
  }
  local_38.X = (pAVar8->__Pos).X;
  local_38.Y = (pAVar8->__Pos).Y;
  local_38.Z = (pAVar8->__Pos).Z;
  pAVar8 = AActor::StaticSpawn((PClassActor *)APlayerSpeedTrail::RegistrationInfo.MyClass,&local_38,
                               NO_REPLACE,false);
  if (pAVar8 == (AActor *)0x0) {
    return;
  }
  pAVar10 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  (pAVar8->Angles).Yaw.Degrees = (pAVar10->Angles).Yaw.Degrees;
  pAVar8->Translation = pAVar10->Translation;
  pAVar10 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  (pAVar8->target).field_0.p = pAVar10;
  pAVar8->sprite = pAVar10->sprite;
  pAVar8->frame = pAVar10->frame;
  pAVar8->Floorclip = pAVar10->Floorclip;
  dVar2 = (pAVar10->Scale).Y;
  (pAVar8->Scale).X = (pAVar10->Scale).X;
  (pAVar8->Scale).Y = dVar2;
  pAVar12 = (AActor *)(&DAT_00a60408)[(long)consoleplayer * 0x54];
  if (pAVar12 != (AActor *)0x0) {
    if (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00607508;
    (&DAT_00a60408)[(long)consoleplayer * 0x54] = 0;
    pAVar10 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  }
  pAVar12 = (AActor *)0x0;
LAB_00607508:
  if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    pAVar10 = (AActor *)0x0;
  }
  if ((pAVar10 == pAVar12) && ((pAVar10->player->cheats & 0x20) == 0)) {
    pbVar1 = (byte *)((long)&(pAVar8->renderflags).Value + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return;
}

Assistant:

void APowerSpeed::DoEffect ()
{
	Super::DoEffect ();
	
	if (Owner == NULL || Owner->player == NULL)
		return;

	if (Owner->player->cheats & CF_PREDICTING)
		return;

	if (SpeedFlags & PSF_NOTRAIL)
		return;

	if (level.time & 1)
		return;

	// Check if another speed item is present to avoid multiple drawing of the speed trail.
	// Only the last PowerSpeed without PSF_NOTRAIL set will actually draw the trail.
	for (AInventory *item = Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf(RUNTIME_CLASS(APowerSpeed)) &&
			!(static_cast<APowerSpeed *>(item)->SpeedFlags & PSF_NOTRAIL))
		{
			return;
		}
	}

	if (Owner->Vel.LengthSquared() <= 12*12)
		return;

	AActor *speedMo = Spawn<APlayerSpeedTrail> (Owner->Pos(), NO_REPLACE);
	if (speedMo)
	{
		speedMo->Angles.Yaw = Owner->Angles.Yaw;
		speedMo->Translation = Owner->Translation;
		speedMo->target = Owner;
		speedMo->sprite = Owner->sprite;
		speedMo->frame = Owner->frame;
		speedMo->Floorclip = Owner->Floorclip;

		// [BC] Also get the scale from the owner.
		speedMo->Scale = Owner->Scale;

		if (Owner == players[consoleplayer].camera &&
			!(Owner->player->cheats & CF_CHASECAM))
		{
			speedMo->renderflags |= RF_INVISIBLE;
		}
	}
}